

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_NoiseBox.cpp
# Opt level: O0

int NoiseBox::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  uint uVar2;
  EffectData *pEVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int local_58;
  uint local_54;
  int i;
  uint n;
  float mulgain;
  float addgain;
  float mulperiod;
  float addperiod;
  Data *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar3 = UnityAudioEffectState::GetEffectData<NoiseBox::EffectData>(state);
  if ((((state->field_0).field_0.flags & 1) == 0) || (((state->field_0).field_0.flags & 6) != 0)) {
    memcpy(outbuffer,inbuffer,(ulong)length * 4 * (long)inchannels);
  }
  else {
    fVar4 = ((float)(state->field_0).field_0.samplerate * 0.5) / (pEVar3->field_0).data.p[2];
    uVar2 = (state->field_0).field_0.samplerate;
    fVar1 = (pEVar3->field_0).data.p[3];
    fVar5 = powf(10.0,(pEVar3->field_0).data.p[0] * 0.05);
    fVar6 = powf(10.0,(pEVar3->field_0).data.p[1] * 0.05);
    for (local_54 = 0; local_54 < length; local_54 = local_54 + 1) {
      for (local_58 = 0; local_58 < outchannels; local_58 = local_58 + 1) {
        outbuffer[local_54 * outchannels + local_58] =
             inbuffer[local_54 * outchannels + local_58] *
             (fVar6 * (pEVar3->field_0).data.mulnoise + (1.0 - fVar6)) +
             fVar5 * (pEVar3->field_0).data.addnoise;
      }
      (pEVar3->field_0).data.addcount = (pEVar3->field_0).data.addcount + 1.0;
      if (fVar4 <= (pEVar3->field_0).data.addcount) {
        (pEVar3->field_0).data.addcount = (pEVar3->field_0).data.addcount - fVar4;
        fVar7 = Random::GetFloat(&(pEVar3->field_0).data.random,-1.0,1.0);
        (pEVar3->field_0).data.addnoise = fVar7;
      }
      (pEVar3->field_0).data.mulcount = (pEVar3->field_0).data.mulcount + 1.0;
      if (fVar4 <= (pEVar3->field_0).data.mulcount) {
        (pEVar3->field_0).data.mulcount =
             (pEVar3->field_0).data.mulcount - ((float)uVar2 * 0.5) / fVar1;
        fVar7 = Random::GetFloat(&(pEVar3->field_0).data.random,0.0,1.0);
        (pEVar3->field_0).data.mulnoise = fVar7;
      }
    }
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;

        if ((state->flags & UnityAudioEffectStateFlags_IsPlaying) == 0 || (state->flags & (UnityAudioEffectStateFlags_IsMuted | UnityAudioEffectStateFlags_IsPaused)) != 0)
        {
            memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);
            return UNITY_AUDIODSP_OK;
        }

        const float addperiod = state->samplerate * 0.5f / data->p[P_ADDFREQ];
        const float mulperiod = state->samplerate * 0.5f / data->p[P_MULFREQ];
        const float addgain = powf(10.0f, 0.05f * data->p[P_ADDAMT]);
        const float mulgain = powf(10.0f, 0.05f * data->p[P_MULAMT]);

        for (unsigned int n = 0; n < length; n++)
        {
            for (int i = 0; i < outchannels; i++)
            {
                outbuffer[n * outchannels + i] = inbuffer[n * outchannels + i] * (1.0f - mulgain + mulgain * data->mulnoise) + addgain * data->addnoise;
            }
            data->addcount += 1.0f; if (data->addcount >= addperiod)
            {
                data->addcount -= addperiod; data->addnoise = data->random.GetFloat(-1.0, 1.0f);
            }
            data->mulcount += 1.0f; if (data->mulcount >= addperiod)
            {
                data->mulcount -= mulperiod; data->mulnoise = data->random.GetFloat(0.0, 1.0f);
            }
        }

        return UNITY_AUDIODSP_OK;
    }